

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetLinkerTool
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
  *p_Var1;
  cmMakefile *pcVar2;
  cmLocalGenerator *pcVar3;
  bool bVar4;
  int iVar5;
  cmValue l;
  string *psVar6;
  char *pcVar7;
  long lVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Alloc_hider this_00;
  _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
  *p_Var9;
  size_type sVar10;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view r;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  allocator<char> local_99;
  string linkerType;
  string local_78;
  string *local_58;
  string usingLinker;
  
  pcVar7 = "";
  if (this->DeviceLink != false) {
    pcVar7 = "DEVICE_";
  }
  linkerType._M_dataplus._M_p = pcVar7;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[8],char_const*,char_const(&)[8]>
            (&usingLinker,(char (*) [7])0x6cf18b,lang,(char (*) [8])0x6fc6f0,(char **)&linkerType,
             (char (*) [8])0x714dcf);
  pcVar2 = this->Makefile;
  cmStrCat<std::__cxx11::string&,char_const(&)[5]>(&linkerType,&usingLinker,(char (*) [5])0x6cd7b6);
  l = cmMakefile::GetDefinition(pcVar2,&linkerType);
  std::__cxx11::string::~string((string *)&linkerType);
  if ((l.Value == (string *)0x0) ||
     (r._M_str = "TOOL", r._M_len = 4, bVar4 = ::operator!=(l,r), bVar4)) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkerType,"CMAKE_LINKER",(allocator<char> *)&local_78);
    psVar6 = (string *)cmMakefile::GetDefinition(pcVar2,&linkerType);
    if (psVar6 == (string *)0x0) {
      psVar6 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
    goto LAB_00441eb5;
  }
  GetLinkerTypeProperty(&linkerType,this,lang,config);
  if (linkerType._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&linkerType);
  }
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&local_78,&usingLinker,&linkerType);
  std::__cxx11::string::operator=((string *)&usingLinker,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  psVar6 = (string *)cmMakefile::GetDefinition(this->Makefile,&usingLinker);
  if (psVar6 == (string *)0x0) {
    iVar5 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
    if (((char)iVar5 != '\0') &&
       (__y._M_str = "DEFAULT", __y._M_len = 7, __x._M_str = linkerType._M_dataplus._M_p,
       __x._M_len = linkerType._M_string_length, bVar4 = std::operator==(__x,__y), bVar4)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_00441eb5;
    }
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"CMAKE_LINKER",&local_99)
    ;
    psVar6 = (string *)cmMakefile::GetDefinition(pcVar2,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    __y_00._M_str = "DEFAULT";
    __y_00._M_len = 7;
    __x_00._M_str = linkerType._M_dataplus._M_p;
    __x_00._M_len = linkerType._M_string_length;
    __it._M_current = (char *)linkerType._M_dataplus;
    bVar4 = std::operator!=(__x_00,__y_00);
    if (!bVar4) goto LAB_00441e9e;
    p_Var1 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
              *)(linkerType._M_dataplus._M_p + linkerType._M_string_length);
    this_00 = linkerType._M_dataplus;
    sVar10 = linkerType._M_string_length;
    local_58 = psVar6;
    for (lVar8 = (long)linkerType._M_string_length >> 2;
        p_Var9 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                  *)this_00._M_p, 0 < lVar8; lVar8 = lVar8 + -1) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
              ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                            *)this_00._M_p,__it);
      if (bVar4) goto LAB_00442017;
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
              ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                            *)this_00._M_p + 1,__it);
      p_Var9 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                *)this_00._M_p + 1;
      if (bVar4) goto LAB_00442017;
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
              ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                            *)this_00._M_p + 2,__it);
      p_Var9 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                *)this_00._M_p + 2;
      if (bVar4) goto LAB_00442017;
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
              ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                            *)this_00._M_p + 3,__it);
      p_Var9 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                *)this_00._M_p + 3;
      if (bVar4) goto LAB_00442017;
      this_00._M_p = this_00._M_p + 4;
      sVar10 = sVar10 - 4;
    }
    if (sVar10 == 1) {
LAB_004420c1:
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
              ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                            *)this_00._M_p,__it);
      p_Var9 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                *)this_00._M_p;
      if (!bVar4) {
        p_Var9 = p_Var1;
      }
LAB_00442017:
      if (p_Var9 == p_Var1) goto LAB_00442060;
      pcVar3 = this->LocalGenerator;
      cmStrCat<char_const(&)[14],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string&,char_const(&)[12]>
                (&local_78,(char (*) [14])"LINKER_TYPE \'",&linkerType,
                 (char (*) [45])"\' is unknown. Did you forget to define the \'",&usingLinker,
                 (char (*) [12])"\' variable?");
      cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_78);
    }
    else {
      if (sVar10 == 2) {
LAB_004420ae:
        bVar4 = __gnu_cxx::__ops::
                _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
                ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                              *)this_00._M_p,__it);
        p_Var9 = (_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                  *)this_00._M_p;
        if (!bVar4) {
          this_00._M_p = this_00._M_p + 1;
          goto LAB_004420c1;
        }
        goto LAB_00442017;
      }
      if (sVar10 == 3) {
        bVar4 = __gnu_cxx::__ops::
                _Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0::operator()(std::__cxx11::string_const&)const::{lambda(char)#1}>
                ::operator()((_Iter_negate<cmGeneratorTarget::GetLinkerTool(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0::operator()(std::__cxx11::string_const&)const::_lambda(char)_1_>
                              *)this_00._M_p,__it);
        if (!bVar4) {
          this_00._M_p = this_00._M_p + 1;
          goto LAB_004420ae;
        }
        goto LAB_00442017;
      }
LAB_00442060:
      pcVar3 = this->LocalGenerator;
      cmStrCat<char_const(&)[14],std::__cxx11::string&,char_const(&)[49]>
                (&local_78,(char (*) [14])"LINKER_TYPE \'",&linkerType,
                 (char (*) [49])"\' is unknown or not supported by this toolchain.");
      cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_78);
    }
    psVar6 = local_58;
    std::__cxx11::string::~string((string *)&local_78);
  }
LAB_00441e9e:
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
LAB_00441eb5:
  std::__cxx11::string::~string((string *)&linkerType);
  std::__cxx11::string::~string((string *)&usingLinker);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTool(const std::string& lang,
                                             const std::string& config) const
{
  auto usingLinker =
    cmStrCat("CMAKE_", lang, "_USING_", this->IsDeviceLink() ? "DEVICE_" : "",
             "LINKER_");
  auto format = this->Makefile->GetDefinition(cmStrCat(usingLinker, "MODE"));
  if (!format || format != "TOOL"_s) {
    return this->Makefile->GetDefinition("CMAKE_LINKER");
  }

  auto linkerType = this->GetLinkerTypeProperty(lang, config);
  if (linkerType.empty()) {
    linkerType = "DEFAULT";
  }
  usingLinker = cmStrCat(usingLinker, linkerType);
  auto linkerTool = this->Makefile->GetDefinition(usingLinker);

  if (!linkerTool) {
    if (this->GetGlobalGenerator()->IsVisualStudio() &&
        linkerType == "DEFAULT"_s) {
      return std::string{};
    }

    // fall-back to generic definition
    linkerTool = this->Makefile->GetDefinition("CMAKE_LINKER");

    if (linkerType != "DEFAULT"_s) {
      auto isCMakeLinkerType = [](const std::string& type) -> bool {
        return std::all_of(type.cbegin(), type.cend(),
                           [](char c) { return std::isupper(c); });
      };
      if (isCMakeLinkerType(linkerType)) {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown or not supported by this toolchain."));
      } else {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown. Did you forget to define the '", usingLinker,
                   "' variable?"));
      }
    }
  }

  return linkerTool;
}